

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::matrix3d>
          (Attribute *this,double t,matrix3d *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  optional<tinyusdz::value::matrix3d> local_c8;
  undefined1 local_71 [73];
  
  if (dst == (matrix3d *)0x0) {
    local_c8.has_value_ = false;
  }
  else {
    if ((NAN(t)) &&
       (((this->_var)._blocked != false ||
        (((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
          (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
         ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
          (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))))) {
      primvar::PrimVar::get_value<tinyusdz::value::matrix3d>(&local_c8,&this->_var);
      bVar2 = local_c8.has_value_;
      if (local_c8.has_value_ == true) {
        memcpy(local_71,&local_c8.contained,0x48);
        memcpy(dst,local_71,0x48);
      }
      if (bVar2 != false) {
        return true;
      }
    }
    if ((this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      primvar::PrimVar::get_value<tinyusdz::value::matrix3d>(&local_c8,&this->_var);
      if (local_c8.has_value_ == true) {
        memcpy(local_71,&local_c8.contained,0x48);
        memcpy(dst,local_71,0x48);
      }
    }
    else {
      local_c8.has_value_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix3d>
                     (&this->_var,t,tinterp,dst);
    }
  }
  return local_c8.has_value_;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }